

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

bool __thiscall cmCTestBuildHandler::IsLaunchedErrorFile(cmCTestBuildHandler *this,char *fname)

{
  bool bVar1;
  bool local_39;
  string_view local_38;
  string_view local_28;
  char *local_18;
  char *fname_local;
  cmCTestBuildHandler *this_local;
  
  local_18 = fname;
  fname_local = (char *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,fname);
  bVar1 = cmHasLiteralPrefix<7ul>(local_28,(char (*) [7])"error-");
  local_39 = false;
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,local_18);
    local_39 = cmHasLiteralSuffix<5ul>(local_38,(char (*) [5])0xd1405b);
  }
  return local_39;
}

Assistant:

bool cmCTestBuildHandler::IsLaunchedErrorFile(const char* fname)
{
  // error-{hash}.xml
  return (cmHasLiteralPrefix(fname, "error-") &&
          cmHasLiteralSuffix(fname, ".xml"));
}